

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O1

int archive_write_disk_set_standard_lookup(archive *a)

{
  void *__s;
  void *__s_00;
  
  __s = malloc(0x7f0);
  __s_00 = malloc(0x7f0);
  memset(__s,0,0x7f0);
  memset(__s_00,0,0x7f0);
  archive_write_disk_set_group_lookup(a,__s_00,lookup_gid,cleanup);
  archive_write_disk_set_user_lookup(a,__s,lookup_uid,cleanup);
  return 0;
}

Assistant:

int
archive_write_disk_set_standard_lookup(struct archive *a)
{
	struct bucket *ucache = malloc(cache_size * sizeof(struct bucket));
	struct bucket *gcache = malloc(cache_size * sizeof(struct bucket));
	memset(ucache, 0, cache_size * sizeof(struct bucket));
	memset(gcache, 0, cache_size * sizeof(struct bucket));
	archive_write_disk_set_group_lookup(a, gcache, lookup_gid, cleanup);
	archive_write_disk_set_user_lookup(a, ucache, lookup_uid, cleanup);
	return (ARCHIVE_OK);
}